

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

int gpu_strcasecmp(char *s1,char *s2)

{
  byte bVar1;
  uchar u2;
  byte *pbStack_20;
  uchar u1;
  char *s2_local;
  char *s1_local;
  
  pbStack_20 = (byte *)s2;
  s2_local = s1;
  do {
    bVar1 = *s2_local;
    if (""[bVar1] != ""[*pbStack_20]) {
      return (uint)""[bVar1] - (uint)""[*pbStack_20];
    }
    pbStack_20 = pbStack_20 + 1;
    s2_local = s2_local + 1;
  } while (bVar1 != 0);
  return 0;
}

Assistant:

int gpu_strcasecmp(const char* s1, const char* s2)
{
    unsigned char u1, u2;

    do
    {
        u1 = (unsigned char) *s1++;
        u2 = (unsigned char) *s2++;
        if (caseless_charmap[u1] != caseless_charmap[u2])
            return caseless_charmap[u1] - caseless_charmap[u2];
	} while (u1 != '\0');

    return 0;
}